

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O2

void ParseChassisInformation(EeePChassisInfo_t *info)

{
  byte blockId;
  char *pcVar1;
  uint8_t *base;
  
  base = &info->CElement[0].ElementType + (ulong)info->CElementSize * (ulong)info->CElementCnt;
  pcVar1 = GetSmbiosString(info->Manufacturer,base);
  if (pcVar1 != (char *)0x0) {
    printf("      Manufacturer: %s\n",pcVar1);
  }
  blockId = info->Type;
  pcVar1 = FindChassisTypeText(blockId);
  printf("      Chassis Type: %d (%s)\n",(ulong)blockId,pcVar1);
  pcVar1 = GetSmbiosString(info->Version,base);
  if (pcVar1 != (char *)0x0) {
    printf("      Version: %s\n",pcVar1);
  }
  pcVar1 = GetSmbiosString(info->SerialNumber,base);
  if (pcVar1 != (char *)0x0) {
    printf("      Serial Number: %s\n",pcVar1);
  }
  pcVar1 = GetSmbiosString(info->AssetTagNumber,base);
  if (pcVar1 != (char *)0x0) {
    printf("      Asset Tag: %s\n",pcVar1);
  }
  printf("      Height: %dU\n",(ulong)info->Height);
  printf("      Number of Power Cords: %d\n",(ulong)info->NumPowerCords);
  return;
}

Assistant:

void ParseChassisInformation(EeePChassisInfo_t *info)
{
    void *strstart = (unsigned char *)info->CElement + info->CElementCnt * info->CElementSize;
    const char *str;
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        printf("      Manufacturer: %s\n", str);
    }
    printf("      Chassis Type: %d (%s)\n",
        info->Type, FindChassisTypeText(info->Type));
    if (str = GetSmbiosString(info->Version, strstart)) {
        printf("      Version: %s\n", str);
    }
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        printf("      Serial Number: %s\n", str);
    }
    if (str = GetSmbiosString(info->AssetTagNumber, strstart)) {
        printf("      Asset Tag: %s\n", str);
    }
    printf("      Height: %dU\n", info->Height);
    printf("      Number of Power Cords: %d\n", info->NumPowerCords);
}